

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O2

bool __thiscall QListViewPrivate::hasRectForIndex(QListViewPrivate *this,QModelIndex *index)

{
  bool bVar1;
  char cVar2;
  long in_FS_OFFSET;
  QModelIndex QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(&this->super_QAbstractItemViewPrivate,index);
  if (bVar1) {
    QModelIndex::parent(&QStack_38,index);
    cVar2 = ::comparesEqual(&(this->super_QAbstractItemViewPrivate).root,&QStack_38);
    if ((cVar2 != '\0') && (index->c == this->column)) {
      bVar1 = isHidden(this,index->r);
      bVar1 = !bVar1;
      goto LAB_0051bca0;
    }
  }
  bVar1 = false;
LAB_0051bca0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool hasRectForIndex(const QModelIndex &index) const
    {
        return isIndexValid(index) && index.parent() == root && index.column() == column && !isHidden(index.row());
    }